

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawTriangleFan(Vector2 *points,int pointCount,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  
  if (2 < pointCount) {
    rlSetTexture(texShapes.id);
    uVar2 = texShapesRec._8_8_;
    uVar1 = texShapesRec._0_8_;
    rlBegin(7);
    rlColor4ub(color.r,color.g,color.b,color.a);
    local_68 = (float)uVar1;
    fStack_64 = SUB84(uVar1,4);
    local_78 = (float)uVar2;
    fStack_74 = SUB84(uVar2,4);
    for (uVar3 = 1; pointCount - 1 != uVar3; uVar3 = uVar3 + 1) {
      rlTexCoord2f(local_68 / (float)texShapes.width,fStack_64 / (float)texShapes.height);
      rlVertex2f(points->x,points->y);
      rlTexCoord2f(local_68 / (float)texShapes.width,
                   (fStack_74 + fStack_64) / (float)texShapes.height);
      rlVertex2f(points[uVar3].x,points[uVar3].y);
      rlTexCoord2f((local_78 + local_68) / (float)texShapes.width,
                   (fStack_74 + fStack_64) / (float)texShapes.height);
      rlVertex2f(points[uVar3 + 1].x,points[uVar3 + 1].y);
      rlTexCoord2f((local_78 + local_68) / (float)texShapes.width,
                   fStack_64 / (float)texShapes.height);
      rlVertex2f(points[uVar3 + 1].x,points[uVar3 + 1].y);
    }
    rlEnd();
    rlSetTexture(0);
    return;
  }
  return;
}

Assistant:

void DrawTriangleFan(const Vector2 *points, int pointCount, Color color)
{
    if (pointCount >= 3)
    {
        rlSetTexture(GetShapesTexture().id);
        Rectangle shapeRect = GetShapesTextureRectangle();

        rlBegin(RL_QUADS);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 1; i < pointCount - 1; i++)
            {
                rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
                rlVertex2f(points[0].x, points[0].y);

                rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                rlVertex2f(points[i].x, points[i].y);

                rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);

                rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
        rlSetTexture(0);
    }
}